

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocker.cc
# Opt level: O2

void __thiscall
webrtc::Blocker::Blocker
          (Blocker *this,size_t chunk_size,size_t block_size,size_t num_input_channels,
          size_t num_output_channels,float *window,size_t shift_amount,BlockerCallback *callback)

{
  size_t sVar1;
  float *pfVar2;
  string *psVar3;
  size_t sVar4;
  ulong uVar5;
  FatalMessage local_1a8;
  
  this->chunk_size_ = chunk_size;
  this->block_size_ = block_size;
  this->num_input_channels_ = num_input_channels;
  this->num_output_channels_ = num_output_channels;
  sVar1 = chunk_size;
  sVar4 = shift_amount;
  while (sVar4 != 0) {
    uVar5 = sVar1 % sVar4;
    sVar1 = sVar4;
    sVar4 = uVar5;
  }
  this->initial_delay_ = block_size - sVar1;
  this->frame_offset_ = 0;
  AudioRingBuffer::AudioRingBuffer
            (&this->input_buffer_,num_input_channels,(block_size - sVar1) + chunk_size);
  ChannelBuffer<float>::ChannelBuffer
            (&this->output_buffer_,this->initial_delay_ + this->chunk_size_,
             this->num_output_channels_,1);
  ChannelBuffer<float>::ChannelBuffer
            (&this->input_block_,this->block_size_,this->num_input_channels_,1);
  ChannelBuffer<float>::ChannelBuffer
            (&this->output_block_,this->block_size_,this->num_output_channels_,1);
  pfVar2 = (float *)operator_new__(-(ulong)(this->block_size_ >> 0x3e != 0) | this->block_size_ << 2
                                  );
  (this->window_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  this->shift_amount_ = shift_amount;
  this->callback_ = callback;
  psVar3 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                     (&this->num_output_channels_,&this->num_input_channels_,
                      "num_output_channels_ <= num_input_channels_");
  if (psVar3 == (string *)0x0) {
    psVar3 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                       (&this->shift_amount_,&this->block_size_,"shift_amount_ <= block_size_");
    if (psVar3 == (string *)0x0) {
      memcpy((this->window_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl,window,this->block_size_ << 2);
      AudioRingBuffer::MoveReadPositionBackward(&this->input_buffer_,this->initial_delay_);
      return;
    }
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0x7a,psVar3);
  }
  else {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0x79,psVar3);
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

Blocker::Blocker(size_t chunk_size,
                 size_t block_size,
                 size_t num_input_channels,
                 size_t num_output_channels,
                 const float* window,
                 size_t shift_amount,
                 BlockerCallback* callback)
    : chunk_size_(chunk_size),
      block_size_(block_size),
      num_input_channels_(num_input_channels),
      num_output_channels_(num_output_channels),
      initial_delay_(block_size_ - gcd(chunk_size, shift_amount)),
      frame_offset_(0),
      input_buffer_(num_input_channels_, chunk_size_ + initial_delay_),
      output_buffer_(chunk_size_ + initial_delay_, num_output_channels_),
      input_block_(block_size_, num_input_channels_),
      output_block_(block_size_, num_output_channels_),
      window_(new float[block_size_]),
      shift_amount_(shift_amount),
      callback_(callback) {
  RTC_CHECK_LE(num_output_channels_, num_input_channels_);
  RTC_CHECK_LE(shift_amount_, block_size_);

  memcpy(window_.get(), window, block_size_ * sizeof(*window_.get()));
  input_buffer_.MoveReadPositionBackward(initial_delay_);
}